

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# initest.c
# Opt level: O2

void hralg(double *x,int N,int p,int q,double *phi,double *theta,double *var)

{
  uint uVar1;
  int iVar2;
  uint rows;
  long lVar3;
  double *x_00;
  long lVar4;
  double *phi_00;
  void *__ptr;
  double *sig;
  double *col;
  double *C;
  double *C_00;
  double *x_01;
  int *ipiv;
  ulong uVar5;
  long lVar6;
  double *pdVar7;
  int cols;
  long lVar8;
  ulong uVar9;
  long lVar10;
  uint p_00;
  size_t sVar11;
  double *pdVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  double dVar18;
  double dVar19;
  
  lVar3 = (long)N;
  x_00 = (double *)malloc(lVar3 * 8);
  iVar2 = q;
  if (q < p) {
    iVar2 = p;
  }
  cols = q + p;
  p_00 = 10;
  if (N <= q + p + 0x14) {
    p_00 = iVar2 + 1U;
  }
  if (9 < iVar2) {
    p_00 = iVar2 + 1U;
  }
  lVar4 = (long)(int)p_00;
  phi_00 = (double *)malloc(lVar4 * 8);
  __ptr = malloc(lVar3 * 8);
  rows = N - (p_00 + q);
  lVar16 = (long)cols;
  sVar11 = (int)rows * lVar16 * 8;
  sig = (double *)malloc(sVar11);
  col = (double *)malloc(sVar11);
  sVar11 = lVar16 * 8;
  C = (double *)malloc(sVar11 * lVar16);
  C_00 = (double *)malloc(sVar11);
  x_01 = (double *)malloc(sVar11);
  ipiv = (int *)malloc(lVar16 * 4);
  dVar18 = mean(x,N);
  uVar5 = 0;
  uVar17 = 0;
  if (0 < N) {
    uVar17 = (ulong)(uint)N;
  }
  for (; uVar17 != uVar5; uVar5 = uVar5 + 1) {
    x_00[uVar5] = x[uVar5] - dVar18;
  }
  ywalg(x_00,N,p_00,phi_00);
  for (uVar5 = 0; uVar17 != uVar5; uVar5 = uVar5 + 1) {
    *(undefined8 *)((long)__ptr + uVar5 * 8) = 0;
  }
  uVar1 = p_00;
  if ((int)p_00 < 1) {
    uVar1 = 0;
  }
  lVar6 = (lVar4 << 0x20) + -0x100000000;
  for (lVar8 = lVar4; lVar8 < lVar3; lVar8 = lVar8 + 1) {
    dVar18 = x_00[lVar8];
    *(double *)((long)__ptr + lVar8 * 8) = dVar18;
    lVar10 = lVar6;
    for (uVar5 = 0; uVar1 != uVar5; uVar5 = uVar5 + 1) {
      dVar18 = dVar18 - phi_00[uVar5] * *(double *)((long)x_00 + (lVar10 >> 0x1d));
      *(double *)((long)__ptr + lVar8 * 8) = dVar18;
      lVar10 = lVar10 + -0x100000000;
    }
    lVar6 = lVar6 + 0x100000000;
  }
  uVar17 = 0;
  uVar5 = 0;
  if (0 < p) {
    uVar5 = (ulong)(uint)p;
  }
  uVar15 = 0;
  if (0 < q) {
    uVar15 = (ulong)(uint)q;
  }
  lVar8 = (long)(int)(p_00 + q);
  lVar6 = (long)p;
  uVar9 = 0;
  if (0 < (int)rows) {
    uVar9 = (ulong)rows;
  }
  pdVar7 = sig + lVar6;
  lVar10 = (lVar8 << 0x20) + -0x100000000;
  pdVar12 = sig;
  for (; uVar17 != uVar9; uVar17 = uVar17 + 1) {
    lVar13 = lVar10;
    for (uVar14 = 0; uVar5 != uVar14; uVar14 = uVar14 + 1) {
      pdVar12[uVar14] = *(double *)((long)x_00 + (lVar13 >> 0x1d));
      lVar13 = lVar13 + -0x100000000;
    }
    lVar13 = lVar10;
    for (uVar14 = 0; uVar15 != uVar14; uVar14 = uVar14 + 1) {
      pdVar7[uVar14] = -*(double *)((long)__ptr + (lVar13 >> 0x1d));
      lVar13 = lVar13 + -0x100000000;
    }
    pdVar12 = pdVar12 + lVar16;
    lVar10 = lVar10 + 0x100000000;
    pdVar7 = pdVar7 + lVar16;
  }
  mtranspose(sig,rows,cols,col);
  mmult(col,sig,C,cols,rows,cols);
  mmult(col,x_00 + lVar4 + q,C_00,cols,rows,1);
  ludecomp(C,cols,ipiv);
  linsolve(C,cols,C_00,ipiv,x_01);
  for (uVar17 = 0; pdVar7 = theta, uVar5 != uVar17; uVar17 = uVar17 + 1) {
    phi[uVar17] = x_01[uVar17];
  }
  for (; lVar6 < lVar16; lVar6 = lVar6 + 1) {
    *pdVar7 = x_01[lVar6];
    pdVar7 = pdVar7 + 1;
  }
  lVar4 = (lVar8 << 0x20) + -0x100000000;
  dVar18 = 0.0;
  for (; lVar8 < lVar3; lVar8 = lVar8 + 1) {
    dVar19 = x_00[lVar8];
    lVar16 = lVar4;
    for (uVar17 = 0; uVar5 != uVar17; uVar17 = uVar17 + 1) {
      dVar19 = dVar19 - phi[uVar17] * *(double *)((long)x_00 + (lVar16 >> 0x1d));
      lVar16 = lVar16 + -0x100000000;
    }
    lVar16 = lVar4;
    for (uVar17 = 0; uVar15 != uVar17; uVar17 = uVar17 + 1) {
      dVar19 = dVar19 + theta[uVar17] * *(double *)((long)__ptr + (lVar16 >> 0x1d));
      lVar16 = lVar16 + -0x100000000;
    }
    dVar18 = dVar18 + dVar19 * dVar19;
    lVar4 = lVar4 + 0x100000000;
  }
  *var = dVar18 / (double)(int)rows;
  free(x_00);
  free(phi_00);
  free(__ptr);
  free(sig);
  free(col);
  free(C);
  free(C_00);
  free(ipiv);
  free(x_01);
  return;
}

Assistant:

void hralg(double *x, int N, int p,int q, double *phi,double *theta, double *var) {
	int m,i,t,pq,j,k;
	double wmean,sos;
	double *inp,*phim,*a,*z,*zt,*A,*b,*temp;
	int *ipiv;

	inp = (double*)malloc(sizeof(double)* N);

	if (p > q) {
		m = p;
	}
	else {
		m = q;
	}

	if (m < 10  && N > p+q+20) {
		m = 10;
	}
	else {
		m = m + 1;
	}

	pq = p + q;

	phim = (double*)malloc(sizeof(double)* m);
	a = (double*)malloc(sizeof(double)* N);
	z = (double*)malloc(sizeof(double)* (N - m - q) * pq);
	zt = (double*)malloc(sizeof(double)* (N - m - q) * pq);
	A = (double*)malloc(sizeof(double)* pq * pq);
	b = (double*)malloc(sizeof(double)* pq);
	temp = (double*)malloc(sizeof(double)* pq);
	ipiv = (int*)malloc(sizeof(int)* pq);

	wmean = mean(x, N);

	for (i = 0; i < N; ++i) {
		inp[i] = x[i] - wmean;
	}

	// Estimate AR(m) coefficients

	ywalg(inp, N, m, phim);

	for (i = 0; i < N; ++i) {
		a[i] = 0.0;
	}

	for (t = m; t < N; ++t) {
		a[t] = inp[t];
		for (i = 0; i < m; ++i) {
			a[t] -= phim[i] * inp[t - i - 1];
		}
	}

	for (i = 0; i < N - m - q; ++i) {
		t = i * pq;
		for (j = 0; j < p; ++j) {
			z[t + j] = inp[m + q + i - j - 1];
		}

		for (k = 0; k < q; ++k) {
			z[t + p + k] = -a[m + q + i - k - 1];
		}
	}

	mtranspose(z, N - m - q, pq, zt);
	mmult(zt, z, A, pq, N - m - q, pq);
	mmult(zt, inp + m + q, b, pq, N - m - q, 1);


	ludecomp(A, pq, ipiv);
	linsolve(A, pq, b, ipiv, temp);

	for (i = 0; i < p; ++i) {
		phi[i] = temp[i];
	}

	for (i = p; i < pq; ++i) {
		theta[i-p] = temp[i];
	}
	sos = 0.0;
	for (t = m+q; t < N; ++t) {
		wmean = inp[t];
		for (i = 0; i < p; ++i) {
			wmean -= (phi[i] * inp[t - i - 1]);
		}

		for (i = 0; i < q; ++i) {
			wmean += (theta[i] * a[t - i - 1]);
		}

		sos += (wmean*wmean);
	}

	*var = sos / (N - m - q);

	free(inp);
	free(phim);
	free(a);
	free(z);
	free(zt);
	free(A);
	free(b);
	free(ipiv);
	free(temp);
}